

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

statement_base * __thiscall
cs::method_loop::translate
          (method_loop *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw,tree_type<cs::token_base_*> *cond)

{
  ulong uVar1;
  element_type *peVar2;
  token_base *ptVar3;
  _Elt_pointer pdVar4;
  int iVar5;
  token_base **pptVar6;
  bool *pbVar7;
  statement_loop_until *this_00;
  undefined4 extraout_var;
  _Elt_pointer pptVar8;
  long lVar9;
  ulong uVar10;
  context_t *context_00;
  long lVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *this_02;
  _Self __tmp;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  allocator_type local_231;
  tree_type<cs::token_base_*> local_230;
  context_t local_228;
  context_t local_218;
  context_t local_208;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_1f8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_1d8;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_188;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_138;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_e8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_98;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_48;
  
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            (&local_1d8,0);
  peVar2 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1f8._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_1f8._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  local_1f8._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_1f8._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar11 = (long)local_1f8._M_cur - (long)local_1f8._M_first;
  lVar9 = lVar11 >> 4;
  uVar1 = lVar9 * -0x3333333333333333 + 1;
  if (uVar1 < 6) {
    local_1f8._M_cur = local_1f8._M_cur + 1;
  }
  else {
    if (lVar11 < -0x4f) {
      uVar10 = ~((lVar9 * 0x3333333333333333 - 2U) / 6);
    }
    else {
      uVar10 = uVar1 / 6;
    }
    local_1f8._M_node = local_1f8._M_node + uVar10;
    local_1f8._M_first = *local_1f8._M_node;
    local_1f8._M_last = local_1f8._M_first + 6;
    local_1f8._M_cur = local_1f8._M_first + uVar10 * -6 + uVar1;
  }
  local_48._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_48._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_48._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_48._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)&local_188,&local_1f8,&local_48,&local_231);
  context_00 = &peVar2->context;
  translator_type::translate
            (&peVar2->translator,context_00,&local_188,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_1d8,false)
  ;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque(&local_188);
  local_188.
  super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)cond->mRoot;
  pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_188);
  ptVar3 = *pptVar6;
  if (ptVar3 != (token_base *)0x0) {
    iVar5 = (*ptVar3->_vptr_token_base[2])(ptVar3);
    if (iVar5 == 7) {
      pbVar7 = cs_impl::any::const_val<bool>((any *)(ptVar3 + 1));
      if (*pbVar7 == true) {
        this_00 = (statement_loop_until *)
                  statement_base::operator_new((statement_base *)0x70,(size_t)context_00);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_98,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_1d8)
        ;
        local_208.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_208.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
        if (local_208.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_208.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_208.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_208.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_208.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        pdVar4 = (raw->
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar8 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar8 ==
            (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_first) {
          pptVar8 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        this_02 = &local_98;
        statement_block::statement_block
                  ((statement_block *)this_00,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_02,
                   &local_208,pptVar8[-1]);
        this_01._M_pi =
             local_208.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
      }
      else {
        this_00 = (statement_loop_until *)
                  statement_base::operator_new((statement_base *)0x70,(size_t)context_00);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_e8,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_1d8)
        ;
        local_218.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_218.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
        if (local_218.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_218.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_218.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_218.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_218.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        pdVar4 = (raw->
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar8 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar8 ==
            (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_first) {
          pptVar8 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        this_02 = &local_e8;
        statement_loop::statement_loop
                  ((statement_loop *)this_00,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_02,
                   &local_218,pptVar8[-1]);
        this_01._M_pi =
             local_218.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
      }
      if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
      }
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (this_02);
      goto LAB_0027e6e9;
    }
  }
  this_00 = (statement_loop_until *)
            statement_base::operator_new((statement_base *)0x78,(size_t)context_00);
  iVar5 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)cond->mRoot,(EVP_PKEY_CTX *)0x0);
  local_230.mRoot = (tree_node *)CONCAT44(extraout_var,iVar5);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_138,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_1d8);
  local_228.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_228.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_228.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_228.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_228.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_228.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_228.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  pdVar4 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar8 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (pptVar8 ==
      (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar8 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  statement_loop_until::statement_loop_until
            (this_00,&local_230,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_138,
             &local_228,pptVar8[-1]);
  if (local_228.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_138);
  tree_type<cs::token_base_*>::destroy(local_230.mRoot);
LAB_0027e6e9:
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_1d8);
  return &this_00->super_statement_base;
}

Assistant:

statement_base *method_loop::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw,
	                                       const tree_type<token_base *> &cond)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		token_base *ptr = cond.root().data();
		if (ptr != nullptr && ptr->get_type() == token_types::value) {
			if (static_cast<token_value *>(ptr)->get_value().const_val<bool>())
				return new statement_block(body, context, raw.front().back());
			else
				return new statement_loop(body, context, raw.front().back());
		}
		else
			return new statement_loop_until(cond, body, context, raw.front().back());
	}